

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O0

bool __thiscall
spvtools::val::ValidationState_t::IsCooperativeMatrixBType(ValidationState_t *this,uint32_t id)

{
  bool bVar1;
  uint32_t id_00;
  uint64_t local_30;
  uint64_t matrixUse;
  Instruction *inst;
  ValidationState_t *pVStack_18;
  uint32_t id_local;
  ValidationState_t *this_local;
  
  inst._4_4_ = id;
  pVStack_18 = this;
  bVar1 = IsCooperativeMatrixKHRType(this,id);
  if (bVar1) {
    matrixUse = (uint64_t)FindDef(this,inst._4_4_);
    local_30 = 0;
    id_00 = val::Instruction::word((Instruction *)matrixUse,6);
    bVar1 = EvalConstantValUint64(this,id_00,&local_30);
    if (bVar1) {
      this_local._7_1_ = local_30 == 1;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ValidationState_t::IsCooperativeMatrixBType(uint32_t id) const {
  if (!IsCooperativeMatrixKHRType(id)) return false;
  const Instruction* inst = FindDef(id);
  uint64_t matrixUse = 0;
  if (EvalConstantValUint64(inst->word(6), &matrixUse)) {
    return matrixUse ==
           static_cast<uint64_t>(spv::CooperativeMatrixUse::MatrixBKHR);
  }
  return false;
}